

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawBufferObjectUtil.cpp
# Opt level: O3

SharedPtr<vkt::Draw::Buffer> __thiscall
vkt::Draw::Buffer::create
          (Buffer *this,DeviceInterface *vk,VkDevice device,VkBufferCreateInfo *createInfo)

{
  Allocation *pAVar1;
  undefined8 *puVar2;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<vkt::Draw::Buffer> SVar3;
  Move<vk::Handle<(vk::HandleType)8>_> local_48;
  
  pAVar1 = (Allocation *)operator_new(0x40);
  ::vk::createBuffer(&local_48,vk,device,createInfo,(VkAllocationCallbacks *)0x0);
  pAVar1->_vptr_Allocation = (_func_int **)0x0;
  pAVar1[1]._vptr_Allocation =
       (_func_int **)local_48.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pAVar1[1].m_memory.m_internal =
       (deUint64)local_48.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pAVar1->m_offset = local_48.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  pAVar1->m_hostPtr =
       local_48.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  local_48.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_48.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_48.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_48.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  pAVar1[1].m_offset = (VkDeviceSize)vk;
  pAVar1[1].m_hostPtr = device;
  *(undefined8 *)
   &(this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.field_0x8 = 0;
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = pAVar1;
  puVar2 = (undefined8 *)operator_new(0x20);
  *(undefined4 *)(puVar2 + 1) = 0;
  *(undefined4 *)((long)puVar2 + 0xc) = 0;
  *puVar2 = &PTR__SharedPtrState_00d32438;
  puVar2[2] = pAVar1;
  *(undefined8 **)
   &(this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.field_0x8 = puVar2;
  *(undefined4 *)(puVar2 + 1) = 1;
  *(undefined4 *)((long)puVar2 + 0xc) = 1;
  SVar3.m_state = extraout_RDX;
  SVar3.m_ptr = this;
  return SVar3;
}

Assistant:

de::SharedPtr<Buffer> Buffer::create (const vk::DeviceInterface& vk,
									  vk::VkDevice device,
									  const vk::VkBufferCreateInfo& createInfo)
{
	return de::SharedPtr<Buffer>(new Buffer(vk, device, vk::createBuffer(vk, device, &createInfo)));
}